

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.h
# Opt level: O2

SymbolTable<int,_int> * __thiscall
data_structures::SymbolTable<int,_int>::set(SymbolTable<int,_int> *this,int *key,int *value)

{
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar1;
  SymbolTableElement<int,_int> local_18;
  
  pLVar1 = (this->_list)._header;
  local_18.key = *key;
  do {
    pLVar1 = pLVar1->_next;
    if (pLVar1 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      local_18._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010bc08;
      local_18.value = *value;
      LinkedList<data_structures::SymbolTableElement<int,_int>_>::insertToTail
                (&this->_list,&local_18);
      return this;
    }
  } while ((pLVar1->element).key != local_18.key);
  (pLVar1->element).value = *value;
  return this;
}

Assistant:

inline
    SymbolTable<Key, Value>& SymbolTable<Key, Value>::set(const Key &key, const Value &value){
        for (auto node = _list.begin(); node != _list.end(); node = node->next()) {
            if (node->element.key == key) {
                node->element.value = value;
                return *this;
            }
        }
        _list.insertToTail(SymbolTableElement<Key, Value>(key, value));
        return *this;
    }